

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ConvertMeshes(DXFImporter *this,aiScene *pScene,FileData *output)

{
  pointer paVar1;
  pointer pBVar2;
  __shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  mapped_type pBVar4;
  _Base_ptr __n;
  pointer puVar5;
  pointer puVar6;
  pointer ppPVar7;
  PolyLine *pPVar8;
  uint *puVar9;
  pointer paVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  pointer pvVar14;
  bool bVar15;
  pointer pBVar16;
  Logger *this_00;
  mapped_type *ppBVar17;
  iterator iVar18;
  mapped_type *pmVar19;
  _Rb_tree_node_base *p_Var20;
  aiMesh *this_01;
  pointer ppPVar21;
  aiVector3D *__s;
  aiColor4D *__s_00;
  ulong *puVar22;
  aiFace *paVar23;
  uint *puVar24;
  uint *puVar25;
  ulong uVar26;
  DeadlyImportError *pDVar27;
  aiFace *paVar28;
  uint uVar29;
  undefined8 extraout_RDX;
  ulong uVar30;
  FileData *extraout_RDX_00;
  mapped_type mVar31;
  uint uVar32;
  Block *bl_00;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ostringstream *__k;
  _Rb_tree_node_base *this_02;
  pointer puVar36;
  __shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2> *p_Var37;
  Block *bl;
  mapped_type pBVar38;
  uint *puVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  shared_ptr<const_Assimp::DXF::PolyLine> pl_1;
  vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_> pv;
  LayerMap layers;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  corr;
  element_type *local_1b0;
  BlockMap blocks_by_name;
  
  bVar15 = DefaultLogger::isNullLogger();
  if (!bVar15) {
    pBVar2 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar16 = (output->blocks).
                   super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar16 != pBVar2;
        pBVar16 = pBVar16 + 1) {
      p_Var3 = &((pBVar16->lines).
                 super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>;
      for (p_Var37 = &((pBVar16->lines).
                       super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>;
          p_Var37 != p_Var3; p_Var37 = p_Var37 + 1) {
        std::__shared_ptr<Assimp::DXF::PolyLine_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Assimp::DXF::PolyLine,void>
                  ((__shared_ptr<Assimp::DXF::PolyLine_const,(__gnu_cxx::_Lock_policy)2> *)
                   &blocks_by_name,p_Var37);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &blocks_by_name._M_t._M_impl.super__Rb_tree_header);
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[30]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &blocks_by_name,(char (*) [30])"DXF: Unexpanded polycount is ");
    std::ostream::_M_insert<unsigned_long>((ulong)&blocks_by_name);
    std::operator<<((ostream *)&blocks_by_name,", vertex count is ");
    std::ostream::_M_insert<unsigned_long>((ulong)&blocks_by_name);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,(char *)layers._M_t._M_impl._0_8_);
    std::__cxx11::string::~string((string *)&layers);
    this = (DXFImporter *)&blocks_by_name;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  pBVar38 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar4 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar4 == pBVar38) {
    pDVar27 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blocks_by_name,"DXF: no data blocks loaded",(allocator<char> *)&layers);
    DeadlyImportError::DeadlyImportError(pDVar27,(string *)&blocks_by_name);
    __cxa_throw(pDVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_header;
  blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bl_00 = (Block *)0x0;
  blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; pBVar38 != pBVar4; pBVar38 = pBVar38 + 1) {
    __k = (ostringstream *)&pBVar38->name;
    this = (DXFImporter *)&blocks_by_name;
    ppBVar17 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                             *)&blocks_by_name,(key_type *)__k);
    *ppBVar17 = pBVar38;
    if (bl_00 == (Block *)0x0) {
      bVar15 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k,"$ASSIMP_ENTITIES_MAGIC");
      bl_00 = (mapped_type)0x0;
      this = (DXFImporter *)__k;
      if (bVar15) {
        bl_00 = pBVar38;
      }
    }
  }
  if (bl_00 == (Block *)0x0) {
    pDVar27 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&layers,"DXF: no ENTITIES data block loaded",(allocator<char> *)&pv);
    DeadlyImportError::DeadlyImportError(pDVar27,(string *)&layers);
    __cxa_throw(pDVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &layers._M_t._M_impl.super__Rb_tree_header._M_header;
  layers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  layers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  corr.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  corr.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  corr.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ExpandBlockReferences(this,bl_00,&blocks_by_name);
  p_Var3 = &((bl_00->lines).
             super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>;
  mVar31 = 0;
  for (p_Var37 = &((bl_00->lines).
                   super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>;
      p_Var37 != p_Var3; p_Var37 = p_Var37 + 1) {
    std::__shared_ptr<Assimp::DXF::PolyLine_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::DXF::PolyLine,void>
              ((__shared_ptr<Assimp::DXF::PolyLine_const,(__gnu_cxx::_Lock_policy)2> *)&pl_1,p_Var37
              );
    if (((pl_1.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        ((pl_1.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      iVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find(&layers._M_t,
                      &(pl_1.
                        super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->layer);
      if ((_Rb_tree_header *)iVar18._M_node == &layers._M_t._M_impl.super__Rb_tree_header) {
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
        pmVar19 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)&layers._M_t,
                               &(pl_1.
                                 super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->layer);
        *pmVar19 = mVar31;
        pv.
        super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pv.
        super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pv.
        super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1b0 = pl_1.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
        emplace_back<Assimp::DXF::PolyLine_const*>
                  ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                    *)&pv,&local_1b0);
        std::
        vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
        ::push_back(&corr,(value_type *)&pv);
        mVar31 = mVar31 + 1;
        std::
        _Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
        ::~_Vector_base((_Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                         *)&pv);
      }
      else {
        pv.
        super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)pl_1.
                      super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
        std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
        emplace_back<Assimp::DXF::PolyLine_const*>
                  ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                    *)(corr.
                       super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar18._M_node[2]._M_color),
                   (PolyLine **)&pv);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pl_1.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if ((ulong)pScene->mNumMeshes != 0) {
    uVar33 = (ulong)pScene->mNumMeshes << 3;
    p_Var20 = (_Rb_tree_node_base *)operator_new__(uVar33);
    this_02 = p_Var20;
    memset(p_Var20,0,uVar33);
    auVar41._8_8_ = extraout_RDX;
    auVar41._0_8_ = layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pScene->mMeshes = (aiMesh **)p_Var20;
    do {
      p_Var20 = auVar41._0_8_;
      if ((_Rb_tree_header *)p_Var20 == &layers._M_t._M_impl.super__Rb_tree_header) {
        GenerateHierarchy((DXFImporter *)this_02,pScene,auVar41._8_8_);
        GenerateMaterials((DXFImporter *)this_02,pScene,extraout_RDX_00);
        std::
        vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
        ::~vector(&corr);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&layers._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
        ::~_Rb_tree(&blocks_by_name._M_t);
        return;
      }
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      pScene->mMeshes[p_Var20[2]._M_color] = this_01;
      __n = p_Var20[1]._M_parent;
      if (__n < (_Base_ptr)0x400) {
        (this_01->mName).length = (ai_uint32)__n;
        memcpy((this_01->mName).data,*(void **)(p_Var20 + 1),(size_t)__n);
        (this_01->mName).data[(long)__n] = '\0';
      }
      pvVar14 = corr.
                super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar40 = 0;
      uVar32 = 0;
      for (ppPVar21 = corr.
                      super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[p_Var20[2]._M_color].
                      super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppPVar21 !=
          corr.
          super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[p_Var20[2]._M_color].
          super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppPVar21 = ppPVar21 + 1) {
        puVar6 = ((*ppPVar21)->counts).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar35 = 0;
        puVar5 = ((*ppPVar21)->counts).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (puVar36 = puVar5; puVar36 != puVar6; puVar36 = puVar36 + 1) {
          iVar35 = iVar35 + *puVar36;
        }
        uVar32 = uVar32 + iVar35;
        uVar40 = uVar40 + (int)((ulong)((long)puVar6 - (long)puVar5) >> 2);
      }
      uVar33 = (ulong)uVar32 * 0xc;
      __s = (aiVector3D *)operator_new__(uVar33);
      if (uVar32 != 0) {
        uVar33 = uVar33 - 0xc;
        memset(__s,0,(uVar33 - uVar33 % 0xc) + 0xc);
      }
      this_01->mVertices = __s;
      uVar33 = (ulong)uVar32 << 4;
      __s_00 = (aiColor4D *)operator_new__(uVar33);
      if (uVar32 != 0) {
        memset(__s_00,0,uVar33);
      }
      this_01->mColors[0] = __s_00;
      uVar33 = (ulong)uVar40;
      puVar22 = (ulong *)operator_new__(uVar33 * 0x10 + 8);
      *puVar22 = uVar33;
      paVar28 = (aiFace *)(puVar22 + 1);
      if (uVar40 != 0) {
        paVar23 = paVar28;
        do {
          paVar23->mNumIndices = 0;
          paVar23->mIndices = (uint *)0x0;
          paVar23 = paVar23 + 1;
        } while (paVar23 != paVar28 + uVar33);
      }
      this_01->mFaces = paVar28;
      this_01->mNumVertices = uVar32;
      this_01->mNumFaces = uVar40;
      ppPVar7 = pvVar14[p_Var20[2]._M_color].
                super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar32 = 0;
      uVar33 = 0;
      for (ppPVar21 = pvVar14[p_Var20[2]._M_color].
                      super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppPVar21 != ppPVar7;
          ppPVar21 = ppPVar21 + 1) {
        pPVar8 = *ppPVar21;
        puVar39 = (pPVar8->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar9 = (pPVar8->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (puVar24 = (pPVar8->counts).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar24 != puVar9; puVar24 = puVar24 + 1) {
          uVar40 = *puVar24;
          paVar28->mNumIndices = uVar40;
          puVar25 = (uint *)operator_new__((ulong)uVar40 * 4);
          paVar28->mIndices = puVar25;
          for (uVar34 = 0; uVar40 != uVar34; uVar34 = uVar34 + 1) {
            paVar28->mIndices[uVar34] = (int)uVar33 + (int)uVar34;
            paVar10 = (pPVar8->positions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar26 = ((long)(pPVar8->positions).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10) / 0xc;
            if (uVar26 != (long)(pPVar8->colors).
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pPVar8->colors).
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) {
              __assert_fail("pl->positions.size() == pl->colors.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/DXF/DXFLoader.cpp"
                            ,0x14c,
                            "void Assimp::DXFImporter::ConvertMeshes(aiScene *, DXF::FileData &)");
            }
            uVar30 = (ulong)*puVar39;
            if (uVar26 <= uVar30) {
              pDVar27 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pv,"DXF: vertex index out of bounds",(allocator<char> *)&pl_1);
              DeadlyImportError::DeadlyImportError(pDVar27,(string *)&pv);
              __cxa_throw(pDVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            __s->z = paVar10[uVar30].z;
            fVar11 = paVar10[uVar30].y;
            __s->x = paVar10[uVar30].x;
            __s->y = fVar11;
            __s = __s + 1;
            uVar29 = *puVar39;
            puVar39 = puVar39 + 1;
            paVar1 = (pPVar8->colors).
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar29;
            fVar11 = paVar1->g;
            fVar12 = paVar1->b;
            fVar13 = paVar1->a;
            __s_00->r = paVar1->r;
            __s_00->g = fVar11;
            __s_00->b = fVar12;
            __s_00->a = fVar13;
            __s_00 = __s_00 + 1;
          }
          uVar29 = paVar28->mNumIndices - 1;
          uVar40 = 8;
          if (uVar29 < 3) {
            uVar40 = *(uint *)(&DAT_005d4e80 + (ulong)uVar29 * 4);
          }
          uVar33 = (uVar33 & 0xffffffff) + uVar34;
          uVar32 = uVar32 | uVar40;
          paVar28 = paVar28 + 1;
        }
      }
      this_01->mPrimitiveTypes = uVar32;
      this_01->mMaterialIndex = 0;
      auVar41 = std::_Rb_tree_increment(p_Var20);
      this_02 = p_Var20;
    } while( true );
  }
  pDVar27 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pv,"DXF: this file contains no 3d data",(allocator<char> *)&pl_1);
  DeadlyImportError::DeadlyImportError(pDVar27,(string *)&pv);
  __cxa_throw(pDVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DXFImporter::ConvertMeshes(aiScene* pScene, DXF::FileData& output) {
    // the process of resolving all the INSERT statements can grow the
    // poly-count excessively, so log the original number.
    // XXX Option to import blocks as separate nodes?
    if (!DefaultLogger::isNullLogger()) {
        unsigned int vcount = 0, icount = 0;
        for (const DXF::Block& bl : output.blocks) {
            for (std::shared_ptr<const DXF::PolyLine> pl : bl.lines) {
                vcount += static_cast<unsigned int>(pl->positions.size());
                icount += static_cast<unsigned int>(pl->counts.size());
            }
        }

        ASSIMP_LOG_DEBUG_F("DXF: Unexpanded polycount is ", icount, ", vertex count is ", vcount);
    }

    if (! output.blocks.size()  ) {
        throw DeadlyImportError("DXF: no data blocks loaded");
    }

    DXF::Block* entities( nullptr );

    // index blocks by name
    DXF::BlockMap blocks_by_name;
    for (DXF::Block& bl : output.blocks) {
        blocks_by_name[bl.name] = &bl;
        if ( !entities && bl.name == AI_DXF_ENTITIES_MAGIC_BLOCK ) {
            entities = &bl;
        }
    }

    if (!entities) {
        throw DeadlyImportError("DXF: no ENTITIES data block loaded");
    }

    typedef std::map<std::string, unsigned int> LayerMap;

    LayerMap layers;
    std::vector< std::vector< const DXF::PolyLine*> > corr;

    // now expand all block references in the primary ENTITIES block
    // XXX this involves heavy memory copying, consider a faster solution for future versions.
    ExpandBlockReferences(*entities,blocks_by_name);

    unsigned int cur = 0;
    for (std::shared_ptr<const DXF::PolyLine> pl : entities->lines) {
        if (pl->positions.size()) {

            std::map<std::string, unsigned int>::iterator it = layers.find(pl->layer);
            if (it == layers.end()) {
                ++pScene->mNumMeshes;

                layers[pl->layer] = cur++;

                std::vector< const DXF::PolyLine* > pv;
                pv.push_back(&*pl);

                corr.push_back(pv);
            }
            else {
                corr[(*it).second].push_back(&*pl);
            }
        }
    }

    if ( 0 == pScene->mNumMeshes) {
        throw DeadlyImportError("DXF: this file contains no 3d data");
    }

    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ] ();

    for(const LayerMap::value_type& elem : layers){
        aiMesh* const mesh =  pScene->mMeshes[elem.second] = new aiMesh();
        mesh->mName.Set(elem.first);

        unsigned int cvert = 0,cface = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){
            // sum over all faces since we need to 'verbosify' them.
            cvert += std::accumulate(pl->counts.begin(),pl->counts.end(),0);
            cface += static_cast<unsigned int>(pl->counts.size());
        }

        aiVector3D* verts = mesh->mVertices = new aiVector3D[cvert];
        aiColor4D* colors = mesh->mColors[0] = new aiColor4D[cvert];
        aiFace* faces = mesh->mFaces = new aiFace[cface];

        mesh->mNumVertices = cvert;
        mesh->mNumFaces = cface;

        unsigned int prims = 0;
        unsigned int overall_indices = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){

            std::vector<unsigned int>::const_iterator it = pl->indices.begin();
            for(unsigned int facenumv : pl->counts) {
                aiFace& face = *faces++;
                face.mIndices = new unsigned int[face.mNumIndices = facenumv];

                for (unsigned int i = 0; i < facenumv; ++i) {
                    face.mIndices[i] = overall_indices++;

                    ai_assert(pl->positions.size() == pl->colors.size());
                    if (*it >= pl->positions.size()) {
                        throw DeadlyImportError("DXF: vertex index out of bounds");
                    }

                    *verts++ = pl->positions[*it];
                    *colors++ = pl->colors[*it++];
                }

                // set primitive flags now, this saves the extra pass in ScenePreprocessor.
                switch(face.mNumIndices) {
                    case 1:
                        prims |= aiPrimitiveType_POINT;
                        break;
                    case 2:
                        prims |= aiPrimitiveType_LINE;
                        break;
                    case 3:
                        prims |= aiPrimitiveType_TRIANGLE;
                        break;
                    default:
                        prims |= aiPrimitiveType_POLYGON;
                        break;
                }
            }
        }

        mesh->mPrimitiveTypes = prims;
        mesh->mMaterialIndex = 0;
    }

    GenerateHierarchy(pScene,output);
    GenerateMaterials(pScene,output);
}